

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O2

void M_StartupSkillMenu(FGameStartup *gs)

{
  int *piVar1;
  TDeletingArray<FOptionMenuItem_*,_FOptionMenuItem_*> *this;
  int x;
  FOptionMenuItem *pFVar2;
  double *pdVar3;
  FSkillInfo *pFVar4;
  int iVar5;
  FTextureID patch;
  EColorRange color;
  FMenuDescriptor **ppFVar6;
  FOptionMenuDescriptor *this_00;
  FString *pFVar7;
  FListMenuItemText *pFVar8;
  FString *pFVar9;
  uint i_1;
  uint uVar10;
  int iVar11;
  uint j;
  ulong uVar12;
  char *pcVar13;
  int y;
  uint uVar14;
  uint i;
  ulong uVar15;
  long lVar16;
  FName n;
  FName local_58;
  FName local_54;
  ulong local_50;
  TArray<FListMenuItem_*,_FListMenuItem_*> *local_48;
  FName local_40;
  FName local_3c;
  FName local_38;
  FName local_34;
  
  local_34.Index = 0x1d9;
  ppFVar6 = TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::
            CheckKey(&MenuDescriptors,&local_34);
  if (ppFVar6 != (FMenuDescriptor **)0x0) {
    this_00 = (FOptionMenuDescriptor *)*ppFVar6;
    if ((this_00->super_FMenuDescriptor).mType != 0) {
      for (uVar15 = 0;
          uVar15 < (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
          uVar15 = uVar15 + 1) {
        pFVar2 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar15];
        if (pFVar2 != (FOptionMenuItem *)0x0) {
          (*(pFVar2->super_FListMenuItem)._vptr_FListMenuItem[1])();
        }
      }
      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Clear
                (&(this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>);
      goto LAB_00359114;
    }
    x = this_00->mScrollPos;
    y = this_00->mIndent;
    this = &this_00->mItems;
    for (uVar15 = 0;
        local_50 = (ulong)(this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count
        , uVar15 < local_50; uVar15 = uVar15 + 1) {
      pFVar2 = (this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>).Array[uVar15];
      (*(pFVar2->super_FListMenuItem)._vptr_FListMenuItem[7])(&n,pFVar2,0);
      uVar12 = uVar15;
      if ((n.Index & 0xfffffffeU) == 0x1da) goto LAB_00358fa2;
    }
    goto LAB_00358fd4;
  }
  goto LAB_003590a6;
LAB_00358fa2:
  for (; uVar12 < (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
      uVar12 = uVar12 + 1) {
    pFVar2 = (this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>).Array[uVar12];
    if (pFVar2 != (FOptionMenuItem *)0x0) {
      (*(pFVar2->super_FListMenuItem)._vptr_FListMenuItem[1])();
    }
  }
  TArray<FListMenuItem_*,_FListMenuItem_*>::Resize
            ((TArray<FListMenuItem_*,_FListMenuItem_*> *)this,(uint)uVar15);
  local_50 = (ulong)(this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
LAB_00358fd4:
  uVar14 = AllSkills.Count;
  if (M_StartupSkillMenu::done == restart) {
LAB_00359239:
    lVar16 = 0x58;
    local_48 = (TArray<FListMenuItem_*,_FListMenuItem_*> *)this;
    for (uVar15 = 0; pFVar4 = AllSkills.Array, uVar15 < AllSkills.Count; uVar15 = uVar15 + 1) {
      uVar14 = 0x1da;
      if (*(char *)((long)&(AllSkills.Array)->ArmorFactor + lVar16) == '\x01') {
        uVar14 = AllEpisodes.Array[gs->Episode].mNoSkill ^ 0x1db;
      }
      if (gs->PlayerClass == (char *)0x0) {
        pFVar7 = (FString *)0x0;
      }
      else {
        pdVar3 = &(AllSkills.Array)->DoubleAmmoFactor;
        FName::FName(&local_38,gs->PlayerClass);
        pFVar7 = TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_>::CheckKey
                           ((TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_> *)
                            ((long)pdVar3 + lVar16),&local_38);
      }
      if ((pFVar7 == (FString *)0x0) &&
         (pcVar13 = *(char **)((long)&pFVar4->AmmoFactor + lVar16), *(int *)(pcVar13 + -0xc) != 0))
      {
        patch = GetMenuTexture(pcVar13);
        pFVar8 = (FListMenuItemText *)operator_new(0x28);
        local_54.Index = uVar14;
        FListMenuItemPatch::FListMenuItemPatch
                  ((FListMenuItemPatch *)pFVar8,this_00->mScrollPos,y,*(int *)&this_00->field_0x5c,
                   (int)(&pFVar4->FastMonsters)[lVar16],patch,&local_54,(int)uVar15);
      }
      else {
        color = FSkillInfo::GetTextColor((FSkillInfo *)((long)pFVar4 + lVar16 + -0x58));
        if (color == CR_UNTRANSLATED) {
          color = *(EColorRange *)&this_00[1].super_FMenuDescriptor.mNetgameMessage.Chars;
        }
        pFVar8 = (FListMenuItemText *)operator_new(0x40);
        pFVar9 = (FString *)((long)&(pFVar4->Name).Index + lVar16);
        if (pFVar7 != (FString *)0x0) {
          pFVar9 = pFVar7;
        }
        local_58.Index = uVar14;
        FListMenuItemText::FListMenuItemText
                  (pFVar8,x,y,*(int *)&this_00->field_0x5c,(int)(&pFVar4->FastMonsters)[lVar16],
                   pFVar9->Chars,*(FFont **)&this_00[1].super_FMenuDescriptor.mMenuName,color,
                   *(EColorRange *)
                    ((long)&this_00[1].super_FMenuDescriptor.mNetgameMessage.Chars + 4),&local_58,
                   (int)uVar15);
      }
      _n = pFVar8;
      TArray<FListMenuItem_*,_FListMenuItem_*>::Push(local_48,(FListMenuItem **)&n);
      y = y + *(int *)&this_00->field_0x5c;
      lVar16 = lVar16 + 0xe8;
    }
    if ((AllSkills.Count == 1) || (AllEpisodes.Array[gs->Episode].mNoSkill != false)) {
      uVar14 = AllSkills.Count - 1 >> 1;
      if ((uint)DefaultSkill < AllSkills.Count) {
        uVar14 = DefaultSkill;
      }
      local_50._0_4_ = uVar14 + (int)local_50;
    }
    else {
      local_50._0_4_ = -1;
    }
    *(int *)&this_00[1].super_FMenuDescriptor._vptr_FMenuDescriptor = (int)local_50;
    return;
  }
  M_StartupSkillMenu::done = restart;
  uVar10 = AllSkills.Count - 1 >> 1;
  if ((uint)DefaultSkill < AllSkills.Count) {
    uVar10 = DefaultSkill;
  }
  *(uint *)&(this_00->mTitle).Chars = uVar10 + (int)local_50;
  iVar5 = y;
  for (uVar15 = 0; local_50 != uVar15; uVar15 = uVar15 + 1) {
    iVar11 = ((this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>).Array[uVar15]->
             super_FListMenuItem).mYpos;
    if (iVar11 < iVar5) {
      iVar5 = iVar11;
    }
  }
  iVar11 = (y - iVar5) + *(int *)&this_00->field_0x5c * uVar14;
  if (uVar14 == 1 || iVar11 < 0xbe) {
    iVar5 = ((iVar5 - iVar11) + 200) / 2 - iVar5;
    if (iVar5 < 0) {
      for (uVar15 = 0; local_50 != uVar15; uVar15 = uVar15 + 1) {
        piVar1 = &((this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>).Array[uVar15]->
                  super_FListMenuItem).mYpos;
        *piVar1 = *piVar1 + iVar5;
      }
      y = y - iVar5;
      this_00->mIndent = y;
    }
    goto LAB_00359239;
  }
  (*(this_00->super_FMenuDescriptor)._vptr_FMenuDescriptor[1])(this_00);
  M_StartupSkillMenu::done = 0;
LAB_003590a6:
  this_00 = (FOptionMenuDescriptor *)operator_new(0x60);
  FOptionMenuDescriptor::FOptionMenuDescriptor(this_00);
  local_3c.Index = 0x1d9;
  ppFVar6 = TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::
            operator[](&MenuDescriptors,&local_3c);
  *ppFVar6 = (FMenuDescriptor *)this_00;
  (this_00->super_FMenuDescriptor).mType = 1;
  (this_00->super_FMenuDescriptor).mMenuName.Index = 0x1d9;
  FString::operator=(&this_00->mTitle,"$MNU_CHOOSESKILL");
  this_00->mSelectedItem = 0;
  (this_00->super_FMenuDescriptor).mClass = (PClass *)0x0;
  this_00->mScrollTop = 0;
  this_00->mScrollPos = 0;
  this_00->mIndent = 0xa0;
  this_00->mPosition = -0xf;
  this_00->mDontDim = false;
LAB_00359114:
  lVar16 = 0x58;
  for (uVar15 = 0; pFVar4 = AllSkills.Array, uVar15 < AllSkills.Count; uVar15 = uVar15 + 1) {
    pcVar13 = "Startgame";
    if ((*(char *)((long)&(AllSkills.Array)->ArmorFactor + lVar16) == '\x01') &&
       (pcVar13 = "StartgameConfirm", AllEpisodes.Array[gs->Episode].mNoSkill != false)) {
      pcVar13 = "Startgame";
    }
    if (gs->PlayerClass == (char *)0x0) {
      pFVar7 = (FString *)0x0;
    }
    else {
      pdVar3 = &(AllSkills.Array)->DoubleAmmoFactor;
      FName::FName(&local_40,gs->PlayerClass);
      pFVar7 = TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_>::CheckKey
                         ((TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_> *)
                          ((long)pdVar3 + lVar16),&local_40);
    }
    pFVar8 = (FListMenuItemText *)operator_new(0x28);
    pFVar9 = (FString *)((long)&(pFVar4->Name).Index + lVar16);
    if (pFVar7 != (FString *)0x0) {
      pFVar9 = pFVar7;
    }
    FOptionMenuItemSubmenu::FOptionMenuItemSubmenu
              ((FOptionMenuItemSubmenu *)pFVar8,pFVar9->Chars,pcVar13,(int)uVar15);
    _n = pFVar8;
    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
              (&(this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
               (FOptionMenuItem **)&n);
    if (M_StartupSkillMenu::done == 0) {
      M_StartupSkillMenu::done = 1;
      uVar14 = AllSkills.Count - 1 >> 1;
      if ((uint)DefaultSkill < AllSkills.Count) {
        uVar14 = DefaultSkill;
      }
      this_00->mSelectedItem = uVar14;
    }
    lVar16 = lVar16 + 0xe8;
  }
  return;
}

Assistant:

void M_StartupSkillMenu(FGameStartup *gs)
{
	static int done = -1;
	bool success = false;
	FMenuDescriptor **desc = MenuDescriptors.CheckKey(NAME_Skillmenu);
	if (desc != NULL)
	{
		if ((*desc)->mType == MDESC_ListMenu)
		{
			FListMenuDescriptor *ld = static_cast<FListMenuDescriptor*>(*desc);
			int x = ld->mXpos;
			int y = ld->mYpos;

			// Delete previous contents
			for(unsigned i=0; i<ld->mItems.Size(); i++)
			{
				FName n = ld->mItems[i]->GetAction(NULL);
				if (n == NAME_Startgame || n == NAME_StartgameConfirm) 
				{
					for(unsigned j=i; j<ld->mItems.Size(); j++)
					{
						delete ld->mItems[j];
					}
					ld->mItems.Resize(i);
					break;
				}
			}

			if (done != restart)
			{
				done = restart;
				int defskill = DefaultSkill;
				if ((unsigned int)defskill >= AllSkills.Size())
				{
					defskill = (AllSkills.Size() - 1) / 2;
				}
				ld->mSelectedItem = ld->mItems.Size() + defskill;

				int posy = y;
				int topy = posy;

				// Get lowest y coordinate of any static item in the menu
				for(unsigned i = 0; i < ld->mItems.Size(); i++)
				{
					int y = ld->mItems[i]->GetY();
					if (y < topy) topy = y;
				}

				// center the menu on the screen if the top space is larger than the bottom space
				int totalheight = posy + AllSkills.Size() * ld->mLinespacing - topy;

				if (totalheight < 190 || AllSkills.Size() == 1)
				{
					int newtop = (200 - totalheight + topy) / 2;
					int topdelta = newtop - topy;
					if (topdelta < 0)
					{
						for(unsigned i = 0; i < ld->mItems.Size(); i++)
						{
							ld->mItems[i]->OffsetPositionY(topdelta);
						}
						y = ld->mYpos = posy - topdelta;
					}
				}
				else
				{
					// too large
					delete ld;
					desc = NULL;
					done = false;
					goto fail;
				}
			}

			unsigned firstitem = ld->mItems.Size();
			for(unsigned int i = 0; i < AllSkills.Size(); i++)
			{
				FSkillInfo &skill = AllSkills[i];
				FListMenuItem *li;
				// Using a different name for skills that must be confirmed makes handling this easier.
				FName action = (skill.MustConfirm && !AllEpisodes[gs->Episode].mNoSkill) ?
					NAME_StartgameConfirm : NAME_Startgame;
				FString *pItemText = NULL;
				if (gs->PlayerClass != NULL)
				{
					pItemText = skill.MenuNamesForPlayerClass.CheckKey(gs->PlayerClass);
				}

				if (skill.PicName.Len() != 0 && pItemText == NULL)
				{
					FTextureID tex = GetMenuTexture(skill.PicName);
					li = new FListMenuItemPatch(ld->mXpos, y, ld->mLinespacing, skill.Shortcut, tex, action, i);
				}
				else
				{
					EColorRange color = (EColorRange)skill.GetTextColor();
					if (color == CR_UNTRANSLATED) color = ld->mFontColor;
					li = new FListMenuItemText(x, y, ld->mLinespacing, skill.Shortcut, 
									pItemText? *pItemText : skill.MenuName, ld->mFont, color,ld->mFontColor2, action, i);
				}
				ld->mItems.Push(li);
				y += ld->mLinespacing;
			}
			if (AllEpisodes[gs->Episode].mNoSkill || AllSkills.Size() == 1)
			{
				ld->mAutoselect = firstitem + M_GetDefaultSkill();
			}
			else
			{
				ld->mAutoselect = -1;
			}
			success = true;
		}
	}
	if (success) return;
fail:
	// Option menu fallback for overlong skill lists
	FOptionMenuDescriptor *od;
	if (desc == NULL)
	{
		od = new FOptionMenuDescriptor;
		if (desc != NULL) delete *desc;
		MenuDescriptors[NAME_Skillmenu] = od;
		od->mType = MDESC_OptionsMenu;
		od->mMenuName = NAME_Skillmenu;
		od->mTitle = "$MNU_CHOOSESKILL";
		od->mSelectedItem = 0;
		od->mScrollPos = 0;
		od->mClass = NULL;
		od->mPosition = -15;
		od->mScrollTop = 0;
		od->mIndent = 160;
		od->mDontDim = false;
	}
	else
	{
		od = static_cast<FOptionMenuDescriptor*>(*desc);
		for(unsigned i=0;i<od->mItems.Size(); i++)
		{
			delete od->mItems[i];
		}
		od->mItems.Clear();
	}
	for(unsigned int i = 0; i < AllSkills.Size(); i++)
	{
		FSkillInfo &skill = AllSkills[i];
		FOptionMenuItem *li;
		// Using a different name for skills that must be confirmed makes handling this easier.
		const char *action = (skill.MustConfirm && !AllEpisodes[gs->Episode].mNoSkill) ?
			"StartgameConfirm" : "Startgame";

		FString *pItemText = NULL;
		if (gs->PlayerClass != NULL)
		{
			pItemText = skill.MenuNamesForPlayerClass.CheckKey(gs->PlayerClass);
		}
		li = new FOptionMenuItemSubmenu(pItemText? *pItemText : skill.MenuName, action, i);
		od->mItems.Push(li);
		if (!done)
		{
			done = true;
			od->mSelectedItem = M_GetDefaultSkill();
		}
	}
}